

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  bool bVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  int j_5;
  int i_5;
  float *ptr_3;
  int k;
  float *outptr_5;
  int q_3;
  int j_4;
  float *ptr_2;
  int i_4;
  float *outptr_4;
  int q_2;
  int j_3;
  int i_3;
  float *outptr_3;
  float *ptr_1;
  Mat top_blob_permuted;
  int j_2;
  int i_2;
  int q_1;
  float *outptr_2;
  int z;
  int channels_1;
  int _d;
  int _h_2;
  int _w_2;
  int j_1;
  int i_1;
  float *outptr_1;
  int q;
  int channels;
  int _h_1;
  int _w_1;
  int j;
  int i;
  float *outptr;
  float *ptr;
  int _h;
  int _w;
  Mat bottom_blob_permuted;
  bool need_permute;
  int outc;
  int outd;
  int outh;
  int outw;
  int dims;
  int total;
  size_t elemsize;
  Mat *in_stack_fffffffffffff8b8;
  Mat *in_stack_fffffffffffff8c0;
  Mat *in_stack_fffffffffffff8c8;
  size_t in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  Mat *in_stack_fffffffffffff8e0;
  Mat *in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  Allocator *in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff900;
  undefined7 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90f;
  Allocator *in_stack_fffffffffffff960;
  int in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  Mat *in_stack_fffffffffffff978;
  Allocator *in_stack_fffffffffffff990;
  Mat local_640 [3];
  int local_568;
  int local_564;
  Mat local_560;
  Mat *local_518;
  int local_50c;
  Mat local_508;
  Mat *local_4c0;
  int local_4b8;
  int local_4b4;
  Mat local_4b0;
  float *local_468;
  int local_45c;
  Mat local_458;
  float *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  float *local_3f8;
  float *local_3f0;
  Mat local_310 [3];
  Mat local_238;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  Mat local_1e0;
  float *local_198;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  Mat local_178;
  int local_130;
  int local_12c;
  Mat local_128;
  float *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  float *local_c0;
  Allocator *local_b8;
  undefined4 local_b0;
  int local_a0;
  int local_9c;
  Mat local_98;
  bool local_49;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  size_t local_30;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_30 = in_RSI->elemsize;
  local_34 = in_RSI->w * in_RSI->h * in_RSI->d * in_RSI->c;
  local_38 = in_RSI->dims;
  local_3c = *(int *)(in_RDI + 0xd0);
  local_40 = *(int *)(in_RDI + 0xd4);
  local_44 = *(int *)(in_RDI + 0xd8);
  local_48 = *(int *)(in_RDI + 0xdc);
  if (*(int *)(in_RDI + 0xe4) == 1) {
    if (local_3c == 0) {
      local_3c = in_RSI->w;
    }
    if (local_3c == -1) {
      local_3c = local_34;
    }
    if ((local_38 == 1) && (in_RSI->w == local_3c)) {
      ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      return 0;
    }
  }
  if (*(int *)(in_RDI + 0xe4) == 2) {
    if (local_3c == 0) {
      local_3c = in_RSI->w;
    }
    if (local_40 == 0) {
      local_40 = in_RSI->h;
    }
    if (local_3c == -1) {
      local_3c = local_34 / local_40;
    }
    if (local_40 == -1) {
      local_40 = local_34 / local_3c;
    }
    if ((local_38 == 2) && (in_RSI->h == local_40)) {
      ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      return 0;
    }
  }
  local_20 = in_RDX;
  if (*(int *)(in_RDI + 0xe4) == 3) {
    if (local_3c == 0) {
      local_3c = in_RSI->w;
    }
    if (local_40 == 0) {
      local_40 = in_RSI->h;
    }
    if (local_48 == 0) {
      local_48 = in_RSI->c;
    }
    if (local_3c == -1) {
      local_3c = (int)((long)((ulong)(uint)((int)((long)local_34 / (long)local_48) >> 0x1f) << 0x20
                             | (long)local_34 / (long)local_48 & 0xffffffffU) / (long)local_40);
    }
    if (local_40 == -1) {
      local_40 = (int)((long)((ulong)(uint)((int)((long)local_34 / (long)local_48) >> 0x1f) << 0x20
                             | (long)local_34 / (long)local_48 & 0xffffffffU) / (long)local_3c);
    }
    if (local_48 == -1) {
      local_48 = (int)((long)((ulong)(uint)((int)((long)local_34 / (long)local_40) >> 0x1f) << 0x20
                             | (long)local_34 / (long)local_40 & 0xffffffffU) / (long)local_3c);
    }
    if ((local_38 == 3) && (in_RSI->c == local_48)) {
      ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      local_20->w = local_3c;
      local_20->h = local_40;
      return 0;
    }
  }
  if (*(int *)(in_RDI + 0xe4) == 4) {
    if (local_3c == 0) {
      local_3c = in_RSI->w;
    }
    if (local_40 == 0) {
      local_40 = in_RSI->h;
    }
    if (local_48 == 0) {
      local_48 = in_RSI->c;
    }
    if (local_44 == 0) {
      local_44 = in_RSI->d;
    }
    if (local_3c == -1) {
      uVar1 = (long)((ulong)(uint)((int)((long)local_34 / (long)local_48) >> 0x1f) << 0x20 |
                    (long)local_34 / (long)local_48 & 0xffffffffU) / (long)local_44;
      local_3c = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                      (long)local_40);
    }
    if (local_40 == -1) {
      uVar1 = (long)((ulong)(uint)((int)((long)local_34 / (long)local_48) >> 0x1f) << 0x20 |
                    (long)local_34 / (long)local_48 & 0xffffffffU) / (long)local_44;
      local_40 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                      (long)local_3c);
    }
    if (local_44 == -1) {
      uVar1 = (long)((ulong)(uint)((int)((long)local_34 / (long)local_48) >> 0x1f) << 0x20 |
                    (long)local_34 / (long)local_48 & 0xffffffffU) / (long)local_40;
      local_44 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                      (long)local_3c);
    }
    if (local_48 == -1) {
      uVar1 = (long)((ulong)(uint)((int)((long)local_34 / (long)local_44) >> 0x1f) << 0x20 |
                    (long)local_34 / (long)local_44 & 0xffffffffU) / (long)local_40;
      local_48 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                      (long)local_3c);
    }
    if ((local_38 == 4) && (in_RSI->c == local_48)) {
      ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      local_20->w = local_3c;
      local_20->h = local_40;
      local_20->d = local_44;
      return 0;
    }
  }
  local_49 = *(int *)(in_RDI + 0xe0) == 1;
  if (((local_38 == 2) && (*(int *)(in_RDI + 0xe4) == 2)) && (in_RSI->h == local_40)) {
    local_49 = false;
  }
  if (((local_38 == 3) && (*(int *)(in_RDI + 0xe4) == 3)) && (in_RSI->c == local_48)) {
    local_49 = false;
  }
  if (((local_38 == 4) && (*(int *)(in_RDI + 0xe4) == 4)) && (in_RSI->c == local_48)) {
    local_49 = false;
  }
  if (local_49 == false) {
    if (*(int *)(in_RDI + 0xe4) == 1) {
      ncnn::Mat::reshape((Mat *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
                         (int)((ulong)in_stack_fffffffffffff900 >> 0x20),in_stack_fffffffffffff8f8);
      ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      ncnn::Mat::~Mat((Mat *)0x4f7542);
    }
    if (*(int *)(in_RDI + 0xe4) == 2) {
      ncnn::Mat::reshape((Mat *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
                         (int)((ulong)in_stack_fffffffffffff900 >> 0x20),
                         (int)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      ncnn::Mat::~Mat((Mat *)0x4f75d0);
    }
    if (*(int *)(in_RDI + 0xe4) == 3) {
      in_stack_fffffffffffff8c8 = local_640;
      ncnn::Mat::reshape(in_stack_fffffffffffff978,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                         in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
      ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      ncnn::Mat::~Mat((Mat *)0x4f766a);
    }
    if (*(int *)(in_RDI + 0xe4) == 4) {
      in_stack_fffffffffffff8c0 = (Mat *)&stack0xfffffffffffff978;
      ncnn::Mat::reshape(in_stack_fffffffffffff978,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                         in_stack_fffffffffffff96c,in_stack_fffffffffffff968,
                         in_stack_fffffffffffff990);
      ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      ncnn::Mat::~Mat((Mat *)0x4f7712);
    }
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
    if (!bVar2) {
      return 0;
    }
    return -100;
  }
  local_18 = in_RSI;
  ncnn::Mat::Mat(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  if (local_38 == 2) {
    local_9c = local_18->w;
    local_a0 = local_18->h;
    ncnn::Mat::create(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                      (int)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                      (Allocator *)in_stack_fffffffffffff8c8);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
    in_stack_fffffffffffff96c = CONCAT13(bVar2,(int3)in_stack_fffffffffffff96c);
    if (bVar2) {
      local_4 = -100;
      local_b0 = 1;
      goto LAB_004f74bf;
    }
    in_stack_fffffffffffff960 = (Allocator *)ncnn::Mat::operator_cast_to_float_(local_18);
    local_b8 = in_stack_fffffffffffff960;
    local_c0 = ncnn::Mat::operator_cast_to_float_(&local_98);
    for (local_c4 = 0; local_c4 < local_9c; local_c4 = local_c4 + 1) {
      for (local_c8 = 0; local_c8 < local_a0; local_c8 = local_c8 + 1) {
        *local_c0 = *(float *)((long)&local_b8->_vptr_Allocator +
                              (long)(local_c8 * local_9c + local_c4) * 4);
        local_c0 = local_c0 + 1;
      }
    }
  }
  if (local_38 == 3) {
    local_cc = local_18->w;
    local_d0 = local_18->h;
    local_d4 = local_18->c;
    ncnn::Mat::create(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                      (int)in_stack_fffffffffffff8d8,(int)(in_stack_fffffffffffff8d0 >> 0x20),
                      (size_t)in_stack_fffffffffffff8c8,(Allocator *)in_stack_fffffffffffff8c0);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
    if (bVar2) {
      local_4 = -100;
      local_b0 = 1;
      goto LAB_004f74bf;
    }
    for (local_d8 = 0; local_d8 < local_d0; local_d8 = local_d8 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff8e8,(int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
      pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_128);
      ncnn::Mat::~Mat((Mat *)0x4f66b3);
      local_e0 = pfVar3;
      for (local_12c = 0; local_12c < local_cc; local_12c = local_12c + 1) {
        for (local_130 = 0; local_130 < local_d4; local_130 = local_130 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff8e8,
                             (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
          pfVar3 = ncnn::Mat::row(&local_178,local_d8);
          *local_e0 = pfVar3[local_12c];
          local_e0 = local_e0 + 1;
          ncnn::Mat::~Mat((Mat *)0x4f677a);
        }
      }
    }
  }
  if (local_38 == 4) {
    local_17c = local_18->w;
    local_180 = local_18->h;
    local_184 = local_18->d;
    local_188 = local_18->c;
    ncnn::Mat::create(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                      (int)in_stack_fffffffffffff8d8,(int)(in_stack_fffffffffffff8d0 >> 0x20),
                      (int)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,
                      (Allocator *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
    if (bVar2) {
      local_4 = -100;
      local_b0 = 1;
      goto LAB_004f74bf;
    }
    for (local_18c = 0; local_18c < local_184; local_18c = local_18c + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff8e8,(int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
      pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_1e0);
      ncnn::Mat::~Mat((Mat *)0x4f6946);
      local_198 = pfVar3;
      for (local_1e4 = 0; local_1e4 < local_180; local_1e4 = local_1e4 + 1) {
        for (local_1e8 = 0; local_1e8 < local_17c; local_1e8 = local_1e8 + 1) {
          for (local_1ec = 0; local_1ec < local_188; local_1ec = local_1ec + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffff8e8,
                               (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
            ncnn::Mat::depth(in_stack_fffffffffffff8c8,
                             (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
            pfVar3 = ncnn::Mat::row(&local_238,local_1e4);
            *local_198 = pfVar3[local_1e8];
            local_198 = local_198 + 1;
            ncnn::Mat::~Mat((Mat *)0x4f6a41);
            ncnn::Mat::~Mat((Mat *)0x4f6a4e);
          }
        }
      }
    }
  }
  if (*(int *)(in_RDI + 0xe4) == 1) {
    ncnn::Mat::reshape((Mat *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
                       (int)((ulong)in_stack_fffffffffffff900 >> 0x20),in_stack_fffffffffffff8f8);
    ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    ncnn::Mat::~Mat((Mat *)0x4f6b80);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
    if (bVar2) {
      local_4 = -100;
      local_b0 = 1;
    }
    else {
      local_4 = 0;
      local_b0 = 1;
    }
    goto LAB_004f74bf;
  }
  ncnn::Mat::Mat(local_310);
  if (*(int *)(in_RDI + 0xe4) == 2) {
    ncnn::Mat::reshape((Mat *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
                       (int)((ulong)in_stack_fffffffffffff900 >> 0x20),
                       (int)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
    ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    ncnn::Mat::~Mat((Mat *)0x4f6c72);
  }
  if (*(int *)(in_RDI + 0xe4) == 3) {
    ncnn::Mat::reshape(in_stack_fffffffffffff978,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                       in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    ncnn::Mat::~Mat((Mat *)0x4f6d25);
  }
  if (*(int *)(in_RDI + 0xe4) == 4) {
    ncnn::Mat::reshape(in_stack_fffffffffffff978,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                       in_stack_fffffffffffff96c,in_stack_fffffffffffff968,in_stack_fffffffffffff990
                      );
    ncnn::Mat::operator=(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    ncnn::Mat::~Mat((Mat *)0x4f6dcd);
  }
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xe4) == 2) {
      ncnn::Mat::create(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                        (int)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                        (Allocator *)in_stack_fffffffffffff8c8);
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
      if (bVar2) {
        local_4 = -100;
        goto LAB_004f74a1;
      }
      local_3f0 = ncnn::Mat::operator_cast_to_float_(local_310);
      local_3f8 = ncnn::Mat::operator_cast_to_float_(local_20);
      for (local_3fc = 0; local_3fc < local_40; local_3fc = local_3fc + 1) {
        for (local_400 = 0; local_400 < local_3c; local_400 = local_400 + 1) {
          *local_3f8 = local_3f0[local_400 * local_40 + local_3fc];
          local_3f8 = local_3f8 + 1;
        }
      }
    }
    if (*(int *)(in_RDI + 0xe4) == 3) {
      ncnn::Mat::create(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                        (int)in_stack_fffffffffffff8d8,(int)(in_stack_fffffffffffff8d0 >> 0x20),
                        (size_t)in_stack_fffffffffffff8c8,(Allocator *)in_stack_fffffffffffff8c0);
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
      if (bVar2) {
        local_4 = -100;
        goto LAB_004f74a1;
      }
      for (local_404 = 0; local_404 < local_48; local_404 = local_404 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffff8e8,(int)((ulong)in_stack_fffffffffffff8e0 >> 0x20)
                          );
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_458);
        ncnn::Mat::~Mat((Mat *)0x4f7078);
        local_410 = pfVar3;
        for (local_45c = 0; local_45c < local_40; local_45c = local_45c + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff8e8,
                             (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
          pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_4b0);
          ncnn::Mat::~Mat((Mat *)0x4f70e3);
          for (local_4b4 = 0; local_4b4 < local_3c; local_4b4 = local_4b4 + 1) {
            *local_410 = pfVar3[local_4b4 * local_48 + local_404];
            local_410 = local_410 + 1;
          }
          local_468 = pfVar3;
        }
      }
    }
    if (*(int *)(in_RDI + 0xe4) == 4) {
      ncnn::Mat::create(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                        (int)in_stack_fffffffffffff8d8,(int)(in_stack_fffffffffffff8d0 >> 0x20),
                        (int)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,
                        (Allocator *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff8c0);
      if (bVar2) {
        local_4 = -100;
        goto LAB_004f74a1;
      }
      for (local_4b8 = 0; local_4b8 < local_48; local_4b8 = local_4b8 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffff8e8,(int)((ulong)in_stack_fffffffffffff8e0 >> 0x20)
                          );
        in_stack_fffffffffffff8e8 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_508);
        ncnn::Mat::~Mat((Mat *)0x4f72d2);
        local_4c0 = in_stack_fffffffffffff8e8;
        for (local_50c = 0; local_50c < local_44; local_50c = local_50c + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff8e8,
                             (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
          in_stack_fffffffffffff8e0 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_560);
          ncnn::Mat::~Mat((Mat *)0x4f733d);
          for (local_564 = 0; local_564 < local_40; local_564 = local_564 + 1) {
            for (local_568 = 0; local_568 < local_3c; local_568 = local_568 + 1) {
              *(float *)&local_4c0->data =
                   *(float *)((long)&in_stack_fffffffffffff8e0->data +
                             (long)(local_564 * local_3c * local_48 + local_568 * local_48 +
                                   local_4b8) * 4);
              local_4c0 = (Mat *)((long)&local_4c0->data + 4);
            }
          }
          local_518 = in_stack_fffffffffffff8e0;
        }
      }
    }
    local_4 = 0;
  }
LAB_004f74a1:
  local_b0 = 1;
  ncnn::Mat::~Mat((Mat *)0x4f74ae);
LAB_004f74bf:
  ncnn::Mat::~Mat((Mat *)0x4f74cc);
  return local_4;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    // resolve out shape

    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    bool need_permute = permute == 1;
    if (dims == 2 && ndim == 2 && bottom_blob.h == outh)
        need_permute = false;
    if (dims == 3 && ndim == 3 && bottom_blob.c == outc)
        need_permute = false;
    if (dims == 4 && ndim == 4 && bottom_blob.c == outc)
        need_permute = false;

    if (need_permute)
    {
        Mat bottom_blob_permuted = bottom_blob;

        if (dims == 2)
        {
            // hw -> wh
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;

            bottom_blob_permuted.create(_h, _w, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = bottom_blob_permuted;

            for (int i = 0; i < _w; i++)
            {
                for (int j = 0; j < _h; j++)
                {
                    *outptr++ = ptr[j * _w + i];
                }
            }
        }
        if (dims == 3)
        {
            // chw -> hwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < _h; q++)
            {
                float* outptr = bottom_blob_permuted.channel(q);

                for (int i = 0; i < _w; i++)
                {
                    for (int j = 0; j < channels; j++)
                    {
                        *outptr++ = bottom_blob.channel(j).row(q)[i];
                    }
                }
            }
        }

        if (dims == 4)
        {
            // cdhw -> dhwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int _d = bottom_blob.d;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, _d, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int z = 0; z < _d; z++)
            {
                float* outptr = bottom_blob_permuted.channel(z);

                for (int q = 0; q < _h; q++)
                {
                    for (int i = 0; i < _w; i++)
                    {
                        for (int j = 0; j < channels; j++)
                        {
                            *outptr++ = bottom_blob.channel(j).depth(z).row(q)[i];
                        }
                    }
                }
            }
        }

        if (ndim == 1)
        {
            top_blob = bottom_blob_permuted.reshape(outw, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        // permute on ndhwc/nhwc/nhc
        Mat top_blob_permuted;
        if (ndim == 2)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outh, outw, opt.workspace_allocator);
        }
        if (ndim == 3)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, opt.workspace_allocator);
        }
        if (ndim == 4)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, outd, opt.workspace_allocator);
        }
        if (top_blob_permuted.empty())
            return -100;

        if (ndim == 2)
        {
            // wh -> hw
            top_blob.create(outw, outh, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = top_blob_permuted;
            float* outptr = top_blob;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    *outptr++ = ptr[j * outh + i];
                }
            }
        }
        if (ndim == 3)
        {
            // hwc -> chw
            top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    const float* ptr = top_blob_permuted.channel(i);

                    for (int j = 0; j < outw; j++)
                    {
                        *outptr++ = ptr[j * outc + q];
                    }
                }
            }
        }
        if (ndim == 4)
        {
            // dhwc -> cdhw
            top_blob.create(outw, outh, outd, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int k = 0; k < outd; k++)
                {
                    const float* ptr = top_blob_permuted.channel(k);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            *outptr++ = ptr[i * outw * outc + j * outc + q];
                        }
                    }
                }
            }
        }

        return 0;
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}